

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void __thiscall
webfront::log::info<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
          (log *this,string_view fmt,basic_string_view<char,_std::char_traits<char>_> *ts,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  double __x;
  string_view fmt_00;
  string local_28;
  
  if (logTypeEnabled._3_1_ == '\x01') {
    fmt_00._M_str = (char *)fmt._M_len;
    fmt_00._M_len = (size_t)this;
    std::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
              (&local_28,fmt_00,(basic_string_view<char,_std::char_traits<char>_> *)fmt._M_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts);
    anon_unknown_4::log(__x);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void warn(string_view fmt, Ts&&... ts) { if (is(Warn)) log(Warn, fmt, std::forward<Ts>(ts)...); }